

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckExternalFiles(Configuration *state,string *sql_statement,bool *print_statement)

{
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(path varchar)|(unlink\\s?\\()",0x10);
  std::__cxx11::string::string((string *)&title,"Files Are Not SQL Data Types",&local_a9);
  std::__cxx11::string::string((string *)&local_48,(string *)&title);
  std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a96ca,&local_a9);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_MEDIUM,
               PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN,&local_48,&local_68,true,0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&title);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckExternalFiles(Configuration& state,
                        const std::string& sql_statement,
                        bool& print_statement){

  std::regex pattern("(path varchar)|(unlink\\s?\\()");
  std::string title = "Files Are Not SQL Data Types";
  PatternType pattern_type = PatternType::PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN;

  auto message =
      "● Resources outside the database are not managed by the database:  "
      "It's common for programmers to be unequivocal that we should always "
      "store files external to the database. "
      "Files don't obey DELETE, transaction isolation, rollback, or work well with "
      "database backup tools. They do not obey SQL access privileges and are not SQL "
      "data types. "
      "Resources outside the database are not managed by the database. "
      "You should consider storing blobs inside the database instead of in "
      "external files. You can save the contents of a BLOB column to a file.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true);

}